

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channeluser.c
# Opt level: O2

_Bool chirc_channeluser_get_or_create
                (chirc_channel_t *channel,chirc_user_t *user,chirc_channeluser_t **channeluser)

{
  UT_hash_bucket *pUVar1;
  UT_hash_handle *pUVar2;
  UT_hash_handle *pUVar3;
  uchar *_hj_key;
  UT_hash_handle *pUVar4;
  UT_hash_bucket *pUVar5;
  ulong uVar6;
  UT_hash_table *pUVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  chirc_channeluser_t *pcVar12;
  uint uVar13;
  uint uVar14;
  chirc_user_t *user_local;
  
  *channeluser = (chirc_channeluser_t *)0x0;
  if ((channel->users != (chirc_channeluser_t *)0x0) &&
     (channel->users != (chirc_channeluser_t *)0x0)) {
    uVar9 = (uint)user;
    iVar10 = (int)((ulong)user >> 0x20) + -0x61c88647;
    uVar13 = (uVar9 & 0xff) +
             ((uVar9 & 0xff000000) - iVar10) + (uVar9 & 0xff00) + (uVar9 & 0xff0000) + 0x9f49bac2 ^
             0x7f76d;
    uVar9 = uVar13 << 8 ^ (iVar10 - uVar13) + 0x1124109;
    uVar11 = uVar9 >> 0xd ^ (-0x1124109 - uVar13) - uVar9;
    uVar13 = uVar11 >> 0xc ^ (uVar13 - uVar9) - uVar11;
    uVar9 = uVar13 << 0x10 ^ (uVar9 - uVar11) - uVar13;
    uVar14 = uVar9 >> 5 ^ (uVar11 - uVar13) - uVar9;
    uVar11 = uVar14 >> 3 ^ (uVar13 - uVar9) - uVar14;
    uVar9 = uVar11 << 10 ^ (uVar9 - uVar14) - uVar11;
    uVar9 = uVar9 >> 0xf ^ uVar14 - (uVar11 + uVar9);
    pUVar7 = (channel->users->hh_from_channel).tbl;
    pUVar4 = pUVar7->buckets[pUVar7->num_buckets - 1 & uVar9].hh_head;
    if (pUVar4 != (UT_hash_handle *)0x0) goto LAB_00102697;
    pcVar12 = (chirc_channeluser_t *)0x0;
    while (*channeluser = pcVar12, pcVar12 != (chirc_channeluser_t *)0x0) {
      if ((((pcVar12->hh_from_channel).hashv == uVar9) && ((pcVar12->hh_from_channel).keylen == 8))
         && (*(pcVar12->hh_from_channel).key == user)) {
        return false;
      }
      pUVar4 = (pcVar12->hh_from_channel).hh_next;
      pcVar12 = (chirc_channeluser_t *)0x0;
      if (pUVar4 != (UT_hash_handle *)0x0) {
        pUVar7 = (channel->users->hh_from_channel).tbl;
LAB_00102697:
        pcVar12 = (chirc_channeluser_t *)((long)pUVar4 - pUVar7->hho);
      }
    }
  }
  pcVar12 = (chirc_channeluser_t *)malloc(0x90);
  *channeluser = pcVar12;
  pcVar12->modes[0] = '\0';
  pcVar12->channel = channel;
  pcVar12->user = user;
  iVar10 = (int)((ulong)channel >> 0x20) + -0x61c88647;
  uVar9 = (uint)channel;
  uVar13 = (uVar9 & 0xff) + ((uVar9 & 0xff000000) - iVar10) + (uVar9 & 0xff00) + (uVar9 & 0xff0000)
           + 0x9f49bac2 ^ 0x7f76d;
  uVar11 = uVar13 << 8 ^ (iVar10 - uVar13) + 0x1124109;
  uVar9 = uVar11 >> 0xd ^ (-0x1124109 - uVar13) - uVar11;
  uVar14 = uVar9 >> 0xc ^ (uVar13 - uVar11) - uVar9;
  uVar13 = uVar14 << 0x10 ^ (uVar11 - uVar9) - uVar14;
  uVar11 = uVar13 >> 5 ^ (uVar9 - uVar14) - uVar13;
  uVar9 = uVar11 >> 3 ^ (uVar14 - uVar13) - uVar11;
  uVar13 = uVar9 << 10 ^ (uVar13 - uVar11) - uVar9;
  uVar9 = uVar13 >> 0xf ^ uVar11 - (uVar9 + uVar13);
  (pcVar12->hh_from_user).hashv = uVar9;
  (pcVar12->hh_from_user).key = &pcVar12->channel;
  (pcVar12->hh_from_user).keylen = 8;
  if (user->channels == (chirc_channeluser_t *)0x0) {
    pUVar7 = (UT_hash_table *)calloc(1,0x40);
    (pcVar12->hh_from_user).prev = (void *)0x0;
    (pcVar12->hh_from_user).next = (void *)0x0;
    (pcVar12->hh_from_user).tbl = pUVar7;
    if (pUVar7 == (UT_hash_table *)0x0) goto LAB_00102d3d;
    pUVar7->tail = &pcVar12->hh_from_user;
    pUVar7->num_buckets = 0x20;
    pUVar7->log2_num_buckets = 5;
    pUVar7->hho = 0x20;
    pUVar5 = (UT_hash_bucket *)calloc(1,0x200);
    pUVar7->buckets = pUVar5;
    pUVar7->signature = 0xa0111fe1;
    if (pUVar5 == (UT_hash_bucket *)0x0) goto LAB_00102d3d;
    user->channels = pcVar12;
    uVar11 = 0x1f;
  }
  else {
    pUVar7 = (user->channels->hh_from_user).tbl;
    (pcVar12->hh_from_user).tbl = pUVar7;
    (pcVar12->hh_from_user).next = (void *)0x0;
    pUVar4 = pUVar7->tail;
    (pcVar12->hh_from_user).prev = (void *)((long)pUVar4 - pUVar7->hho);
    pUVar4->next = pcVar12;
    pUVar7->tail = &(*channeluser)->hh_from_user;
    pUVar5 = pUVar7->buckets;
    uVar11 = pUVar7->num_buckets - 1;
  }
  pUVar7->num_items = pUVar7->num_items + 1;
  uVar11 = uVar11 & uVar9;
  uVar9 = pUVar5[uVar11].count + 1;
  pUVar5[uVar11].count = uVar9;
  pUVar4 = pUVar5[uVar11].hh_head;
  ((*channeluser)->hh_from_user).hh_next = pUVar4;
  ((*channeluser)->hh_from_user).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar4 != (UT_hash_handle *)0x0) {
    pUVar4->hh_prev = &(*channeluser)->hh_from_user;
  }
  pUVar5[uVar11].hh_head = &(*channeluser)->hh_from_user;
  pcVar12 = *channeluser;
  if ((pUVar5[uVar11].expand_mult * 10 + 10 <= uVar9) &&
     (pUVar7 = (pcVar12->hh_from_user).tbl, pUVar7->noexpand == 0)) {
    pUVar5 = (UT_hash_bucket *)calloc(1,(ulong)pUVar7->num_buckets << 5);
    if (pUVar5 == (UT_hash_bucket *)0x0) goto LAB_00102d3d;
    pUVar7 = (pcVar12->hh_from_user).tbl;
    uVar9 = pUVar7->num_buckets;
    pUVar7->ideal_chain_maxlen =
         ((pUVar7->num_items >> ((char)pUVar7->log2_num_buckets + 1U & 0x1f)) + 1) -
         (uint)((uVar9 * 2 - 1 & pUVar7->num_items) == 0);
    pUVar7->nonideal_items = 0;
    for (uVar6 = 0; uVar6 < uVar9; uVar6 = uVar6 + 1) {
      pUVar4 = pUVar7->buckets[uVar6].hh_head;
      while (pUVar4 != (UT_hash_handle *)0x0) {
        pUVar7 = ((*channeluser)->hh_from_user).tbl;
        uVar11 = pUVar7->num_buckets * 2 - 1 & pUVar4->hashv;
        pUVar2 = pUVar4->hh_next;
        pUVar1 = pUVar5 + uVar11;
        uVar9 = pUVar5[uVar11].count + 1;
        pUVar5[uVar11].count = uVar9;
        if (pUVar7->ideal_chain_maxlen < uVar9) {
          pUVar7->nonideal_items = pUVar7->nonideal_items + 1;
          if (pUVar7->ideal_chain_maxlen * pUVar1->expand_mult < uVar9) {
            pUVar1->expand_mult = pUVar1->expand_mult + 1;
          }
        }
        pUVar4->hh_prev = (UT_hash_handle *)0x0;
        pUVar3 = pUVar1->hh_head;
        pUVar4->hh_next = pUVar3;
        if (pUVar3 != (UT_hash_handle *)0x0) {
          pUVar3->hh_prev = pUVar4;
        }
        pUVar1->hh_head = pUVar4;
        pUVar4 = pUVar2;
      }
      pUVar7 = ((*channeluser)->hh_from_user).tbl;
      uVar9 = pUVar7->num_buckets;
    }
    free(pUVar7->buckets);
    pUVar7 = ((*channeluser)->hh_from_user).tbl;
    pUVar7->num_buckets = pUVar7->num_buckets << 1;
    pUVar7->log2_num_buckets = pUVar7->log2_num_buckets + 1;
    pUVar7->buckets = pUVar5;
    pcVar12 = *channeluser;
    pUVar7 = (pcVar12->hh_from_user).tbl;
    if (pUVar7->num_items >> 1 < pUVar7->nonideal_items) {
      uVar9 = pUVar7->ineff_expands + 1;
      pUVar7->ineff_expands = uVar9;
      if (1 < uVar9) {
        pUVar7->noexpand = 1;
      }
    }
    else {
      pUVar7->ineff_expands = 0;
    }
  }
  iVar10 = *(int *)((long)&pcVar12->user + 4) + -0x61c88647;
  uVar13 = (uint)*(byte *)&pcVar12->user +
           ((uint)*(byte *)((long)&pcVar12->user + 3) * 0x1000000 - iVar10) +
           (uint)*(byte *)((long)&pcVar12->user + 1) * 0x100 +
           (uint)*(byte *)((long)&pcVar12->user + 2) * 0x10000 + 0x9f49bac2 ^ 0x7f76d;
  uVar11 = uVar13 << 8 ^ (iVar10 - uVar13) + 0x1124109;
  uVar9 = uVar11 >> 0xd ^ (-0x1124109 - uVar13) - uVar11;
  uVar14 = uVar9 >> 0xc ^ (uVar13 - uVar11) - uVar9;
  uVar13 = uVar14 << 0x10 ^ (uVar11 - uVar9) - uVar14;
  uVar11 = uVar13 >> 5 ^ (uVar9 - uVar14) - uVar13;
  uVar9 = uVar11 >> 3 ^ (uVar14 - uVar13) - uVar11;
  uVar13 = uVar9 << 10 ^ (uVar13 - uVar11) - uVar9;
  uVar9 = uVar13 >> 0xf ^ uVar11 - (uVar9 + uVar13);
  (pcVar12->hh_from_channel).hashv = uVar9;
  (pcVar12->hh_from_channel).key = pcVar12;
  pcVar12 = *channeluser;
  (pcVar12->hh_from_channel).keylen = 8;
  if (channel->users == (chirc_channeluser_t *)0x0) {
    (pcVar12->hh_from_channel).next = (void *)0x0;
    ((*channeluser)->hh_from_channel).prev = (void *)0x0;
    pUVar7 = (UT_hash_table *)malloc(0x40);
    ((*channeluser)->hh_from_channel).tbl = pUVar7;
    pUVar7 = ((*channeluser)->hh_from_channel).tbl;
    if (pUVar7 == (UT_hash_table *)0x0) goto LAB_00102d3d;
    pUVar7->ineff_expands = 0;
    pUVar7->noexpand = 0;
    *(undefined8 *)&pUVar7->signature = 0;
    pUVar7->hho = 0;
    pUVar7->ideal_chain_maxlen = 0;
    pUVar7->nonideal_items = 0;
    *(undefined8 *)&pUVar7->num_items = 0;
    pUVar7->tail = (UT_hash_handle *)0x0;
    pUVar7->buckets = (UT_hash_bucket *)0x0;
    pUVar7->num_buckets = 0;
    pUVar7->log2_num_buckets = 0;
    (((*channeluser)->hh_from_channel).tbl)->tail = &(*channeluser)->hh_from_channel;
    pUVar7 = ((*channeluser)->hh_from_channel).tbl;
    pUVar7->num_buckets = 0x20;
    pUVar7->log2_num_buckets = 5;
    pUVar7->hho = 0x58;
    pUVar5 = (UT_hash_bucket *)malloc(0x200);
    pUVar7->buckets = pUVar5;
    pUVar7 = ((*channeluser)->hh_from_channel).tbl;
    pUVar7->signature = 0xa0111fe1;
    pUVar5 = pUVar7->buckets;
    if (pUVar5 == (UT_hash_bucket *)0x0) goto LAB_00102d3d;
    memset(pUVar5,0,0x200);
    pcVar12 = *channeluser;
    channel->users = pcVar12;
    pUVar7 = (pcVar12->hh_from_channel).tbl;
  }
  else {
    pUVar7 = (channel->users->hh_from_channel).tbl;
    (pcVar12->hh_from_channel).tbl = pUVar7;
    ((*channeluser)->hh_from_channel).next = (void *)0x0;
    pUVar4 = pUVar7->tail;
    ((*channeluser)->hh_from_channel).prev = (void *)((long)pUVar4 - pUVar7->hho);
    pcVar12 = *channeluser;
    pUVar4->next = pcVar12;
    pUVar7->tail = &pcVar12->hh_from_channel;
    pcVar12 = *channeluser;
  }
  pUVar7->num_items = pUVar7->num_items + 1;
  uVar9 = pUVar7->num_buckets - 1 & uVar9;
  pUVar5 = pUVar7->buckets;
  uVar11 = pUVar5[uVar9].count + 1;
  pUVar5[uVar9].count = uVar11;
  pUVar4 = pUVar5[uVar9].hh_head;
  (pcVar12->hh_from_channel).hh_next = pUVar4;
  ((*channeluser)->hh_from_channel).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar4 != (UT_hash_handle *)0x0) {
    pUVar4->hh_prev = &(*channeluser)->hh_from_channel;
  }
  pUVar5[uVar9].hh_head = &(*channeluser)->hh_from_channel;
  if ((pUVar5[uVar9].expand_mult * 10 + 10 <= uVar11) &&
     (pUVar7 = ((*channeluser)->hh_from_channel).tbl, pUVar7->noexpand == 0)) {
    uVar9 = pUVar7->num_buckets;
    uVar6 = (ulong)uVar9;
    pUVar5 = (UT_hash_bucket *)calloc(1,uVar6 << 5);
    if (pUVar5 == (UT_hash_bucket *)0x0) {
LAB_00102d3d:
      exit(-1);
    }
    pUVar7->ideal_chain_maxlen =
         ((pUVar7->num_items >> ((char)pUVar7->log2_num_buckets + 1U & 0x1f)) + 1) -
         (uint)((uVar9 * 2 - 1 & pUVar7->num_items) == 0);
    pUVar7->nonideal_items = 0;
    for (uVar8 = 0; uVar8 < uVar6; uVar8 = uVar8 + 1) {
      pUVar4 = pUVar7->buckets[uVar8].hh_head;
      while (pUVar4 != (UT_hash_handle *)0x0) {
        pUVar7 = ((*channeluser)->hh_from_channel).tbl;
        uVar11 = pUVar7->num_buckets * 2 - 1 & pUVar4->hashv;
        pUVar2 = pUVar4->hh_next;
        pUVar1 = pUVar5 + uVar11;
        uVar9 = pUVar5[uVar11].count + 1;
        pUVar5[uVar11].count = uVar9;
        if (pUVar7->ideal_chain_maxlen < uVar9) {
          pUVar7->nonideal_items = pUVar7->nonideal_items + 1;
          if (pUVar7->ideal_chain_maxlen * pUVar1->expand_mult < uVar9) {
            pUVar1->expand_mult = pUVar1->expand_mult + 1;
          }
        }
        pUVar4->hh_prev = (UT_hash_handle *)0x0;
        pUVar3 = pUVar1->hh_head;
        pUVar4->hh_next = pUVar3;
        if (pUVar3 != (UT_hash_handle *)0x0) {
          pUVar3->hh_prev = pUVar4;
        }
        pUVar1->hh_head = pUVar4;
        pUVar4 = pUVar2;
      }
      pUVar7 = ((*channeluser)->hh_from_channel).tbl;
      uVar6 = (ulong)pUVar7->num_buckets;
    }
    free(pUVar7->buckets);
    pUVar7 = ((*channeluser)->hh_from_channel).tbl;
    pUVar7->num_buckets = pUVar7->num_buckets << 1;
    pUVar7->log2_num_buckets = pUVar7->log2_num_buckets + 1;
    pUVar7->buckets = pUVar5;
    pUVar7 = ((*channeluser)->hh_from_channel).tbl;
    if (pUVar7->num_items >> 1 < pUVar7->nonideal_items) {
      uVar9 = pUVar7->ineff_expands + 1;
      pUVar7->ineff_expands = uVar9;
      if (1 < uVar9) {
        pUVar7->noexpand = 1;
      }
    }
    else {
      pUVar7->ineff_expands = 0;
    }
  }
  return true;
}

Assistant:

bool chirc_channeluser_get_or_create(chirc_channel_t *channel, chirc_user_t *user, chirc_channeluser_t **channeluser)
{
    bool created;

    HASH_FIND(hh_from_channel,channel->users, &user,sizeof(chirc_user_t *), *channeluser);
    if(*channeluser)
    {
        created = false;
    }
    else
    {
        created = true;

        *channeluser = malloc(sizeof(chirc_channeluser_t));
        chirc_channeluser_init(*channeluser);
        (*channeluser)->channel = channel;
        (*channeluser)->user = user;
        HASH_ADD(hh_from_user, user->channels, channel, sizeof(chirc_channel_t *), *channeluser);
        HASH_ADD(hh_from_channel, channel->users, user, sizeof(chirc_user_t *), *channeluser);
    }

    return created;
}